

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# painter.cpp
# Opt level: O0

void __thiscall Painter::update(Painter *this)

{
  Document *pDVar1;
  Status SVar2;
  size_type sVar3;
  const_reference pvVar4;
  element_type *peVar5;
  double dVar6;
  Color local_248;
  Stroke local_230;
  Color local_208;
  Fill local_1f0;
  Point local_1d0;
  Circle local_1c0;
  Color local_158;
  Stroke local_140;
  Color local_118;
  Fill local_100;
  Point local_e0;
  Circle local_d0;
  ulong local_68;
  size_t blue;
  size_t green;
  size_t red;
  size_t color;
  double y;
  double local_30;
  double x;
  shared_ptr<mmWaveBS> dd;
  int i;
  int size;
  Painter *this_local;
  
  sVar3 = std::vector<std::shared_ptr<mmWaveBS>,_std::allocator<std::shared_ptr<mmWaveBS>_>_>::size
                    (this->m_nodes);
  dd.super___shared_ptr<mmWaveBS,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ = (int)sVar3;
  for (dd.super___shared_ptr<mmWaveBS,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_ = 0;
      (int)dd.super___shared_ptr<mmWaveBS,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi <
      dd.super___shared_ptr<mmWaveBS,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_;
      dd.super___shared_ptr<mmWaveBS,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_ =
           (int)dd.super___shared_ptr<mmWaveBS,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi + 1) {
    pvVar4 = std::vector<std::shared_ptr<mmWaveBS>,_std::allocator<std::shared_ptr<mmWaveBS>_>_>::
             operator[](this->m_nodes,
                        (long)(int)dd.super___shared_ptr<mmWaveBS,_(__gnu_cxx::_Lock_policy)2>.
                                   _M_refcount._M_pi);
    std::shared_ptr<mmWaveBS>::shared_ptr((shared_ptr<mmWaveBS> *)&x,pvVar4);
    peVar5 = std::__shared_ptr<mmWaveBS,_(__gnu_cxx::_Lock_policy)2>::get
                       ((__shared_ptr<mmWaveBS,_(__gnu_cxx::_Lock_policy)2> *)&x);
    local_30 = mmWaveBS::getX(peVar5);
    local_30 = local_30 * 0.1;
    peVar5 = std::__shared_ptr<mmWaveBS,_(__gnu_cxx::_Lock_policy)2>::get
                       ((__shared_ptr<mmWaveBS,_(__gnu_cxx::_Lock_policy)2> *)&x);
    dVar6 = mmWaveBS::getY(peVar5);
    color = (size_t)(dVar6 * 0.1);
    peVar5 = std::__shared_ptr<mmWaveBS,_(__gnu_cxx::_Lock_policy)2>::get
                       ((__shared_ptr<mmWaveBS,_(__gnu_cxx::_Lock_policy)2> *)&x);
    red = mmWaveBS::getColor(peVar5);
    green = red >> 0x10 & 0xff;
    blue = red >> 8 & 0xff;
    local_68 = red & 0xff;
    peVar5 = std::__shared_ptr<mmWaveBS,_(__gnu_cxx::_Lock_policy)2>::get
                       ((__shared_ptr<mmWaveBS,_(__gnu_cxx::_Lock_policy)2> *)&x);
    SVar2 = mmWaveBS::getStatus(peVar5);
    if (SVar2 == clusterHead) {
      pDVar1 = this->m_doc;
      svg::Point::Point(&local_e0,local_30,(double)color);
      svg::Color::Color(&local_118,0,0,0);
      svg::Fill::Fill(&local_100,&local_118);
      svg::Color::Color(&local_158,(int)green,(int)blue,(int)local_68);
      svg::Stroke::Stroke(&local_140,1.0,&local_158);
      svg::Circle::Circle(&local_d0,&local_e0,2.0,&local_100,&local_140);
      svg::Document::operator<<(pDVar1,&local_d0.super_Shape);
      svg::Circle::~Circle(&local_d0);
      svg::Stroke::~Stroke(&local_140);
      svg::Color::~Color(&local_158);
      svg::Fill::~Fill(&local_100);
      svg::Color::~Color(&local_118);
    }
    else {
      pDVar1 = this->m_doc;
      svg::Point::Point(&local_1d0,local_30,(double)color);
      svg::Color::Color(&local_208,(int)green,(int)blue,(int)local_68);
      svg::Fill::Fill(&local_1f0,&local_208);
      svg::Color::Color(&local_248,(int)green,(int)blue,(int)local_68);
      svg::Stroke::Stroke(&local_230,1.0,&local_248);
      svg::Circle::Circle(&local_1c0,&local_1d0,2.0,&local_1f0,&local_230);
      svg::Document::operator<<(pDVar1,&local_1c0.super_Shape);
      svg::Circle::~Circle(&local_1c0);
      svg::Stroke::~Stroke(&local_230);
      svg::Color::~Color(&local_248);
      svg::Fill::~Fill(&local_1f0);
      svg::Color::~Color(&local_208);
    }
    svg::Document::save(this->m_doc);
    std::shared_ptr<mmWaveBS>::~shared_ptr((shared_ptr<mmWaveBS> *)&x);
  }
  return;
}

Assistant:

void Painter::update()
{
	int size = m_nodes.size();
	for(int i=0;i<size;i++)
	{
		std::shared_ptr<mmWaveBS> dd = m_nodes[i];
		double x = (0.1) * dd.get()->getX();
		double y = (0.1) * dd.get()->getY();
	
		std::size_t color = dd.get()->getColor();
		std::size_t red = (color & 0xff0000) >> 16; 
		std::size_t green =(color & 0x00ff00) >> 8; 
		std::size_t blue = (color & 0x0000ff);  	
// 		std::cout << "Status = " << dd.get()->getStatus() << std::endl;
		if(dd.get()->getStatus()==Status::clusterHead)
			*m_doc << Circle(Point(x, y), 2, Fill(Color(0,0,0)), Stroke(1, Color(red,green,blue)));
		else
			*m_doc << Circle(Point(x, y), 2, Fill(Color(red,green,blue)), Stroke(1, Color(red, green, blue)));
		
		m_doc->save();
	}
}